

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_and(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  ushort x;
  _Bool _Var1;
  uint uVar2;
  uint pos;
  container_t *c;
  byte bVar3;
  int pos_00;
  ulong uVar4;
  uint32_t cap;
  ulong uVar5;
  uint8_t result_type;
  byte local_45;
  uint local_44;
  uint32_t local_40;
  uint32_t local_3c;
  roaring_array_t *local_38;
  
  local_45 = 0;
  local_3c = (x1->high_low_container).size;
  local_40 = (x2->high_low_container).size;
  cap = local_40;
  if ((int)local_3c < (int)local_40) {
    cap = local_3c;
  }
  local_38 = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
  bVar3 = 1;
  if (((x1->high_low_container).flags & 1) == 0) {
    bVar3 = (x2->high_low_container).flags & 1;
  }
  local_38->flags = local_38->flags & 0xfe | bVar3;
  uVar4 = 0;
  pos = 0;
LAB_00104d2c:
  do {
    uVar5 = uVar4 & 0xffff;
    while( true ) {
      if (((int)local_3c <= (int)pos) || (pos_00 = (int)uVar4, (int)local_40 <= pos_00)) {
        return (roaring_bitmap_t *)local_38;
      }
      uVar2 = pos & 0xffff;
      key = (x1->high_low_container).keys[uVar2];
      x = (x2->high_low_container).keys[uVar5];
      if (key == x) {
        c = container_and((x1->high_low_container).containers[uVar2],
                          (x1->high_low_container).typecodes[uVar2],
                          (x2->high_low_container).containers[uVar5],
                          (x2->high_low_container).typecodes[uVar5],&local_45);
        local_44 = (uint)local_45;
        _Var1 = container_nonzero_cardinality(c,local_45);
        if (_Var1) {
          ra_append(local_38,key,c,(uint8_t)local_44);
        }
        else {
          container_free(c,(uint8_t)local_44);
        }
        pos = pos + 1;
        uVar4 = (ulong)(pos_00 + 1);
        goto LAB_00104d2c;
      }
      if (x <= key) break;
      pos = ra_advance_until(&x1->high_low_container,x,pos);
    }
    uVar2 = ra_advance_until(&x2->high_low_container,key,pos_00);
    uVar4 = (ulong)uVar2;
  } while( true );
}

Assistant:

roaring_bitmap_t *roaring_bitmap_and(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_and(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);  // otherwise: memory leak!
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}